

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O3

void test_dict_basic(void)

{
  int iVar1;
  VALUE_TYPE VVar2;
  VALUE *pVVar3;
  size_t sVar4;
  VALUE *v;
  VALUE *v_00;
  VALUE *pVVar5;
  char *pcVar6;
  VALUE d;
  VALUE *keys [8];
  VALUE VStack_88;
  VALUE *local_78;
  VALUE *local_70;
  VALUE *local_68;
  
  iVar1 = value_init_dict((VALUE *)0x0);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x305,"%s","value_init_dict(NULL) != 0");
  pVVar3 = value_dict_get((VALUE *)0x0,"foo");
  acutest_check_((uint)(pVVar3 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x306,"%s","value_dict_get(NULL, \"foo\") == NULL");
  pVVar3 = value_dict_get_or_add((VALUE *)0x0,"foo");
  acutest_check_((uint)(pVVar3 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x307,"%s","value_dict_get_or_add(NULL, \"foo\") == NULL");
  iVar1 = value_dict_remove((VALUE *)0x0,"foo");
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x308,"%s","value_dict_remove(NULL, \"foo\") != 0");
  iVar1 = value_dict_walk_ordered
                    ((VALUE *)0x0,(_func_int_VALUE_ptr_VALUE_ptr_void_ptr *)0x0,(void *)0x0);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x309,"%s","value_dict_walk_ordered(NULL, NULL, NULL) != 0");
  iVar1 = value_dict_walk_sorted
                    ((VALUE *)0x0,(_func_int_VALUE_ptr_VALUE_ptr_void_ptr *)0x0,(void *)0x0);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x30a,"%s","value_dict_walk_sorted(NULL, NULL, NULL) != 0");
  value_dict_clean((VALUE *)0x0);
  value_init_dict(&VStack_88);
  VVar2 = value_type(&VStack_88);
  acutest_check_((uint)(VVar2 == VALUE_DICT),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x30e,"%s","value_type(&d) == VALUE_DICT");
  iVar1 = value_is_compatible(&VStack_88,VALUE_NULL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x30f,"%s","!value_is_compatible(&d, VALUE_NULL)");
  iVar1 = value_is_compatible(&VStack_88,VALUE_BOOL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x310,"%s","!value_is_compatible(&d, VALUE_BOOL)");
  iVar1 = value_is_compatible(&VStack_88,VALUE_INT32);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x311,"%s","!value_is_compatible(&d, VALUE_INT32)");
  iVar1 = value_is_compatible(&VStack_88,VALUE_UINT32);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x312,"%s","!value_is_compatible(&d, VALUE_UINT32)");
  iVar1 = value_is_compatible(&VStack_88,VALUE_INT64);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x313,"%s","!value_is_compatible(&d, VALUE_INT64)");
  iVar1 = value_is_compatible(&VStack_88,VALUE_UINT64);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x314,"%s","!value_is_compatible(&d, VALUE_UINT64)");
  iVar1 = value_is_compatible(&VStack_88,VALUE_FLOAT);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x315,"%s","!value_is_compatible(&d, VALUE_FLOAT)");
  iVar1 = value_is_compatible(&VStack_88,VALUE_DOUBLE);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x316,"%s","!value_is_compatible(&d, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(&VStack_88,VALUE_ARRAY);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x317,"%s","!value_is_compatible(&d, VALUE_ARRAY)");
  iVar1 = value_is_compatible(&VStack_88,VALUE_DICT);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x318,"%s","value_is_compatible(&d, VALUE_DICT)");
  pVVar3 = value_dict_get(&VStack_88,"n/a");
  acutest_check_((uint)(pVVar3 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x319,"%s","value_dict_get(&d, \"n/a\") == NULL");
  sVar4 = value_dict_size(&VStack_88);
  acutest_check_((uint)(sVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x31a,"%s","value_dict_size(&d) == 0");
  pVVar3 = value_dict_get_or_add(&VStack_88,"new");
  acutest_check_((uint)(pVVar3 != (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x31b,"%s","value_dict_get_or_add(&d, \"new\") != NULL");
  sVar4 = value_dict_size(&VStack_88);
  acutest_check_((uint)(sVar4 == 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x31c,"%s","value_dict_size(&d) == 1");
  value_dict_clean(&VStack_88);
  sVar4 = value_dict_size(&VStack_88);
  acutest_check_((uint)(sVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x31e,"%s","value_dict_size(&d) == 0");
  value_fini(&VStack_88);
  value_init_dict(&VStack_88);
  pVVar3 = value_dict_get_or_add(&VStack_88,"foo");
  value_init_string(pVVar3,"foo value");
  v = value_dict_get_or_add(&VStack_88,"bar");
  value_init_string(v,"bar value");
  v_00 = value_dict_get_or_add(&VStack_88,"baz");
  value_init_string(v_00,"baz value");
  sVar4 = value_dict_size(&VStack_88);
  acutest_check_((uint)(sVar4 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x328,"%s","value_dict_size(&d) == 3");
  pVVar5 = value_dict_get(&VStack_88,"foo");
  acutest_check_((uint)(pVVar5 == pVVar3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x329,"%s","value_dict_get(&d, \"foo\") == foo");
  pVVar5 = value_dict_get(&VStack_88,"bar");
  acutest_check_((uint)(pVVar5 == v),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x32a,"%s","value_dict_get(&d, \"bar\") == bar");
  pVVar5 = value_dict_get(&VStack_88,"baz");
  acutest_check_((uint)(pVVar5 == v_00),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x32b,"%s","value_dict_get(&d, \"baz\") == baz");
  pVVar5 = value_dict_get(&VStack_88,"n/a");
  acutest_check_((uint)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x32c,"%s","value_dict_get(&d, \"n/a\") == NULL");
  pVVar5 = value_dict_get_or_add(&VStack_88,"foo");
  acutest_check_((uint)(pVVar5 == pVVar3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x32d,"%s","value_dict_get_or_add(&d, \"foo\") == foo");
  pVVar3 = value_dict_get_or_add(&VStack_88,"bar");
  acutest_check_((uint)(pVVar3 == v),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x32e,"%s","value_dict_get_or_add(&d, \"bar\") == bar");
  pVVar3 = value_dict_get_or_add(&VStack_88,"baz");
  acutest_check_((uint)(pVVar3 == v_00),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x32f,"%s","value_dict_get_or_add(&d, \"baz\") == baz");
  sVar4 = value_dict_keys_sorted(&VStack_88,&local_78,8);
  acutest_check_((uint)(sVar4 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x331,"%s","value_dict_keys_sorted(&d, keys, 8) == 3");
  pcVar6 = value_string(local_78);
  iVar1 = strcmp(pcVar6,"bar");
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x332,"%s","strcmp(value_string(keys[0]), \"bar\") == 0");
  pcVar6 = value_string(local_70);
  iVar1 = strcmp(pcVar6,"baz");
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x333,"%s","strcmp(value_string(keys[1]), \"baz\") == 0");
  pcVar6 = value_string(local_68);
  iVar1 = strcmp(pcVar6,"foo");
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x334,"%s","strcmp(value_string(keys[2]), \"foo\") == 0");
  value_fini(&VStack_88);
  return;
}

Assistant:

static void
test_dict_basic(void)
{
    VALUE d;
    VALUE* foo;
    VALUE* bar;
    VALUE* baz;
    const VALUE* keys[8];

    TEST_CHECK(value_init_dict(NULL) != 0);
    TEST_CHECK(value_dict_get(NULL, "foo") == NULL);
    TEST_CHECK(value_dict_get_or_add(NULL, "foo") == NULL);
    TEST_CHECK(value_dict_remove(NULL, "foo") != 0);
    TEST_CHECK(value_dict_walk_ordered(NULL, NULL, NULL) != 0);
    TEST_CHECK(value_dict_walk_sorted(NULL, NULL, NULL) != 0);
    value_dict_clean(NULL);

    value_init_dict(&d);
    TEST_CHECK(value_type(&d) == VALUE_DICT);
    TEST_CHECK(!value_is_compatible(&d, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&d, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(&d, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&d, VALUE_UINT32));
    TEST_CHECK(!value_is_compatible(&d, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(&d, VALUE_UINT64));
    TEST_CHECK(!value_is_compatible(&d, VALUE_FLOAT));
    TEST_CHECK(!value_is_compatible(&d, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&d, VALUE_ARRAY));
    TEST_CHECK(value_is_compatible(&d, VALUE_DICT));
    TEST_CHECK(value_dict_get(&d, "n/a") == NULL);
    TEST_CHECK(value_dict_size(&d) == 0);
    TEST_CHECK(value_dict_get_or_add(&d, "new") != NULL);
    TEST_CHECK(value_dict_size(&d) == 1);
    value_dict_clean(&d);
    TEST_CHECK(value_dict_size(&d) == 0);
    value_fini(&d);

    value_init_dict(&d);
    foo = value_dict_get_or_add(&d, "foo");
    value_init_string(foo, "foo value");
    bar = value_dict_get_or_add(&d, "bar");
    value_init_string(bar, "bar value");
    baz = value_dict_get_or_add(&d, "baz");
    value_init_string(baz, "baz value");
    TEST_CHECK(value_dict_size(&d) == 3);
    TEST_CHECK(value_dict_get(&d, "foo") == foo);
    TEST_CHECK(value_dict_get(&d, "bar") == bar);
    TEST_CHECK(value_dict_get(&d, "baz") == baz);
    TEST_CHECK(value_dict_get(&d, "n/a") == NULL);
    TEST_CHECK(value_dict_get_or_add(&d, "foo") == foo);
    TEST_CHECK(value_dict_get_or_add(&d, "bar") == bar);
    TEST_CHECK(value_dict_get_or_add(&d, "baz") == baz);

    TEST_CHECK(value_dict_keys_sorted(&d, keys, 8) == 3);
    TEST_CHECK(strcmp(value_string(keys[0]), "bar") == 0);
    TEST_CHECK(strcmp(value_string(keys[1]), "baz") == 0);
    TEST_CHECK(strcmp(value_string(keys[2]), "foo") == 0);
    value_fini(&d);
}